

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O0

lookahead_entry * av1_lookahead_pop(lookahead_ctx *ctx,int drain,COMPRESSOR_STAGE stage)

{
  read_ctx *prVar1;
  byte in_DL;
  int in_ESI;
  lookahead_ctx *in_RDI;
  read_ctx *read_ctx;
  lookahead_entry *buf;
  lookahead_entry *local_18;
  
  local_18 = (lookahead_entry *)0x0;
  if (((in_RDI != (lookahead_ctx *)0x0) && (prVar1 = in_RDI->read_ctxs + in_DL, prVar1->sz != 0)) &&
     ((in_ESI != 0 || (prVar1->sz == prVar1->pop_sz)))) {
    local_18 = pop(in_RDI,&prVar1->read_idx);
    prVar1->sz = prVar1->sz + -1;
  }
  return local_18;
}

Assistant:

struct lookahead_entry *av1_lookahead_pop(struct lookahead_ctx *ctx, int drain,
                                          COMPRESSOR_STAGE stage) {
  struct lookahead_entry *buf = NULL;
  if (ctx) {
    struct read_ctx *read_ctx = &ctx->read_ctxs[stage];
    assert(read_ctx->valid == 1);
    if (read_ctx->sz && (drain || read_ctx->sz == read_ctx->pop_sz)) {
      buf = pop(ctx, &read_ctx->read_idx);
      read_ctx->sz--;
    }
  }
  return buf;
}